

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O3

int32_t parse_args(Btor2Parser *bfr,Btor2Line *l,uint32_t nargs)

{
  int32_t iVar1;
  int64_t iVar2;
  char *fmt;
  ulong uVar3;
  
  iVar1 = getc_bfr(bfr);
  if (iVar1 == 0x20) {
    if (nargs != 0) {
      uVar3 = 0;
      do {
        iVar2 = parse_arg_bfr(bfr);
        l->args[uVar3] = iVar2;
        if (iVar2 == 0) {
          return 0;
        }
        if ((uVar3 < nargs - 1) && (iVar1 = getc_bfr(bfr), iVar1 != 0x20)) {
          fmt = "expected space after argument (argument missing)";
          goto LAB_00103c72;
        }
        uVar3 = uVar3 + 1;
      } while (nargs != uVar3);
    }
    l->nargs = nargs;
    iVar1 = 1;
  }
  else {
    fmt = "expected space after sort id";
LAB_00103c72:
    iVar1 = 0;
    perr_bfr(bfr,fmt);
  }
  return iVar1;
}

Assistant:

static int32_t
parse_args (Btor2Parser *bfr, Btor2Line *l, uint32_t nargs)
{
  uint32_t i = 0;
  if (getc_bfr (bfr) != ' ')
    return perr_bfr (bfr, "expected space after sort id");
  while (i < nargs)
  {
    if (!(l->args[i] = parse_arg_bfr (bfr))) return 0;
    if (i < nargs - 1 && getc_bfr (bfr) != ' ')
      return perr_bfr (bfr, "expected space after argument (argument missing)");
    i++;
  }
  l->nargs = nargs;
  return 1;
}